

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_setup_pre_planes
               (MACROBLOCKD *xd,int idx,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,
               scale_factors *sf,int num_planes)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  MB_MODE_INFO **ppMVar5;
  MB_MODE_INFO *pMVar6;
  uint8_t *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  anon_union_24_2_4e86ac8b_for_yv12_buffer_config_10 *paVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  
  if (0 < num_planes && src != (YV12_BUFFER_CONFIG *)0x0) {
    uVar10 = 3;
    if ((uint)num_planes < 3) {
      uVar10 = (ulong)(uint)num_planes;
    }
    ppMVar5 = xd->mi;
    paVar13 = &src->field_5;
    lVar16 = 0;
    do {
      pMVar6 = *ppMVar5;
      iVar9 = *(int *)((long)xd->plane[0].pre + lVar16 + -0x2c);
      iVar15 = *(int *)((long)xd->plane[0].pre + lVar16 + -0x28);
      uVar8._0_1_ = pMVar6->bsize;
      uVar8._1_1_ = pMVar6->partition;
      uVar8._2_1_ = pMVar6->mode;
      uVar8._3_1_ = pMVar6->uv_mode;
      uVar14 = (uint)((0x20005UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      if (iVar15 == 0) {
        uVar14 = 0;
      }
      uVar8 = (uint)((0x10003UL >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      if (iVar9 == 0) {
        uVar8 = 0;
      }
      iVar9 = (int)((~uVar8 & mi_col) << 2) >> ((byte)iVar9 & 0x1f);
      iVar15 = (int)((~uVar14 & mi_row) << 2) >> ((byte)iVar15 & 0x1f);
      if (sf != (scale_factors *)0x0) {
        iVar1 = sf->x_scale_fp;
        if ((long)iVar1 != -1) {
          iVar2 = sf->y_scale_fp;
          if (((long)iVar2 != -1) && (iVar2 != 0x4000 || iVar1 != 0x4000)) {
            lVar12 = (long)(iVar1 * 8 + -0x20000) + (long)iVar9 * (long)iVar1;
            if (lVar12 < 0) {
              iVar9 = -(int)((ulong)(0x80 - lVar12) >> 8);
            }
            else {
              iVar9 = (int)((ulong)(lVar12 + 0x80) >> 8);
            }
            lVar12 = (long)(iVar2 * 8 + -0x20000) + (long)iVar15 * (long)iVar2;
            if (lVar12 < 0) {
              iVar15 = -(int)((ulong)(0x80 - lVar12) >> 8);
            }
            else {
              iVar15 = (int)((ulong)(lVar12 + 0x80) >> 8);
            }
            iVar9 = iVar9 >> 6;
            iVar15 = iVar15 >> 6;
          }
        }
      }
      puVar7 = paVar13->buffers[0];
      uVar11 = (ulong)(lVar16 != 0);
      uVar3 = *(undefined4 *)((long)src->store_buf_adr + uVar11 * 4 + -0x38);
      uVar4 = *(undefined4 *)((long)src->store_buf_adr + uVar11 * 4 + -0x30);
      iVar1 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x28);
      *(uint8_t **)((long)&xd->plane[0].pre[idx].buf + lVar16) =
           puVar7 + (long)iVar15 * (long)iVar1 + (long)iVar9;
      *(uint8_t **)((long)&xd->plane[0].pre[idx].buf0 + lVar16) = puVar7;
      *(undefined4 *)((long)&xd->plane[0].pre[idx].width + lVar16) = uVar3;
      *(undefined4 *)((long)&xd->plane[0].pre[idx].height + lVar16) = uVar4;
      *(int *)((long)&xd->plane[0].pre[idx].stride + lVar16) = iVar1;
      paVar13 = (anon_union_24_2_4e86ac8b_for_yv12_buffer_config_10 *)((long)paVar13 + 8);
      lVar16 = lVar16 + 0xa30;
    } while (uVar10 * 0xa30 != lVar16);
  }
  return;
}

Assistant:

void av1_setup_pre_planes(MACROBLOCKD *xd, int idx,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const struct scale_factors *sf,
                          const int num_planes) {
  if (src != NULL) {
    // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
    // the static analysis warnings.
    for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
      struct macroblockd_plane *const pd = &xd->plane[i];
      const int is_uv = i > 0;
      setup_pred_plane(&pd->pre[idx], xd->mi[0]->bsize, src->buffers[i],
                       src->crop_widths[is_uv], src->crop_heights[is_uv],
                       src->strides[is_uv], mi_row, mi_col, sf,
                       pd->subsampling_x, pd->subsampling_y);
    }
  }
}